

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,2,2>>>
::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,2,2>>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,2,2>>>
           *this,DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
                 *rhs)

{
  if ((*(long *)(*(long *)this + 8) == *(long *)rhs) &&
     (*(long *)(*(long *)this + 0x10) == *(long *)(rhs + 8))) {
    internal::
    assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_2,_2>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_2,_2>_>,_0,_0,_0>
    ::run((SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
           *)this,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>
                   *)rhs);
    return (SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
            *)this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double>, Eigen::Block<Eigen::Matrix<double, 2, 2>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 2, 2>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = Eigen::Block<Eigen::Matrix<double, 2, 2>>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 2, 2>>, RhsDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 2, 2>>]"
               );
}

Assistant:

inline Index rows() const { return m_matrix.rows(); }